

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  bitmask<slang::ast::ASTFlags> in_RDX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params;
  ASTContext context;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_000000d0;
  ASTContext *in_stack_000000d8;
  HierarchyInstantiationSyntax *in_stack_000000e0;
  Compilation *in_stack_000000e8;
  undefined1 in_stack_000000f0 [16];
  undefined1 in_stack_00000110 [16];
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_00000120;
  ASTContext *in_stack_ffffffffffffff48;
  bitmask<slang::ast::ASTFlags> local_68 [13];
  
  bitmask<slang::ast::ASTFlags>::bitmask(local_68,NonProcedural);
  ASTContext::resetFlags(in_stack_ffffffffffffff48,in_RDX);
  createUninstantiatedParams
            ((HierarchyInstantiationSyntax *)context.instanceOrProc,
             (ASTContext *)context.flags.m_bits);
  parsing::Token::valueText((Token *)in_RDX.m_bits);
  createUninstantiatedDefs<slang::syntax::HierarchyInstantiationSyntax>
            (in_stack_000000e8,in_stack_000000e0,(string_view)in_stack_000000f0,in_stack_000000d8,
             (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)in_stack_00000110,
             in_stack_000000d0,in_stack_00000120);
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const HierarchyInstantiationSyntax& syntax,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto params = createUninstantiatedParams(syntax, context);

    createUninstantiatedDefs(compilation, syntax, syntax.type.valueText(), context, params, results,
                             implicitNets);
}